

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int qRegisterMetaType<QSocketDescriptor>(char *typeName)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  QByteArray normalizedTypeName;
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::normalizedType(in_stack_ffffffffffffffc8);
  iVar2 = qRegisterNormalizedMetaType<QSocketDescriptor>((QByteArray *)0x429894);
  QByteArray::~QByteArray((QByteArray *)0x4298a4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int qRegisterMetaType(const char *typeName)
{
#ifdef QT_NO_QOBJECT
    QT_PREPEND_NAMESPACE(QByteArray) normalizedTypeName = typeName;
#else
    QT_PREPEND_NAMESPACE(QByteArray) normalizedTypeName = QMetaObject::normalizedType(typeName);
#endif
    return qRegisterNormalizedMetaType<T>(normalizedTypeName);
}